

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,int *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  Printer *this_00;
  pointer pcVar1;
  Nonnull<char_*> pcVar2;
  size_t sVar3;
  long lVar4;
  long *plVar5;
  Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  args_00;
  string_view format_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  long *local_80 [2];
  long local_70 [3];
  Nonnull<char_*> local_58;
  char local_50 [32];
  
  this_00 = this->printer_;
  pcVar2 = absl::lts_20250127::numbers_internal::FastIntToBuffer(*args,local_50);
  local_70[2] = (long)pcVar2 - (long)local_50;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_58 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,local_50,pcVar2);
  pcVar1 = (args_1->_M_dataplus)._M_p;
  plVar5 = local_70;
  local_80[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_80,pcVar1,pcVar1 + args_1->_M_string_length);
  sVar3 = strlen(format);
  args_00.len_ = 2;
  args_00.ptr_ = &local_a0;
  format_00._M_str = format;
  format_00._M_len = sVar3;
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (this_00,args_00,&this->vars_,format_00);
  lVar4 = -0x40;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }